

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t generic_unpack_deep_pointers(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint16_t uVar2;
  uint uVar3;
  exr_coding_channel_info_t *peVar4;
  char cVar5;
  short sVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int32_t *piVar19;
  void *pvVar20;
  ushort uVar21;
  long lVar22;
  uint8_t *cdata;
  float *pfVar23;
  uint uVar24;
  uint8_t *puVar25;
  ulong uVar26;
  
  lVar7 = (long)(decode->chunk).height;
  if (0 < lVar7) {
    uVar3 = (decode->chunk).width;
    piVar19 = decode->sample_count_table;
    pvVar20 = decode->unpacked_buffer;
    sVar6 = decode->channel_count;
    lVar22 = 0;
    do {
      if (0 < sVar6) {
        peVar4 = decode->channels;
        lVar15 = 0;
        do {
          cVar1 = peVar4[lVar15].bytes_per_element;
          if (peVar4[lVar15].field_12.decode_to_ptr == (uint8_t *)0x0) {
            if ((decode->decode_flags & 1) == 0) {
              iVar9 = piVar19[(long)(int)uVar3 + -1];
            }
            else if ((int)uVar3 < 1) {
              iVar9 = 0;
            }
            else {
              uVar26 = 0;
              iVar9 = 0;
              do {
                iVar9 = iVar9 + piVar19[uVar26];
                uVar26 = uVar26 + 1;
              } while (uVar3 != uVar26);
            }
            pvVar20 = (void *)((long)pvVar20 + (long)iVar9 * (long)(int)cVar1);
          }
          else if (0 < (int)uVar3) {
            lVar18 = (long)peVar4[lVar15].user_bytes_per_element;
            iVar9 = peVar4[lVar15].user_pixel_stride;
            puVar25 = peVar4[lVar15].field_12.decode_to_ptr +
                      ((ulong)(long)peVar4[lVar15].user_line_stride >> 3) * lVar22 * 8;
            uVar26 = 0;
            iVar14 = 0;
            do {
              pfVar23 = *(float **)puVar25;
              iVar16 = iVar14;
              iVar8 = piVar19[uVar26];
              if ((decode->decode_flags & 1) != 0) {
                iVar16 = 0;
                iVar8 = iVar14;
              }
              iVar14 = iVar8;
              iVar16 = piVar19[uVar26] - iVar16;
              if (pfVar23 != (float *)0x0) {
                uVar2 = peVar4[lVar15].data_type;
                if (uVar2 == 0) {
                  uVar2 = peVar4[lVar15].user_data_type;
                  if (uVar2 == 2) {
                    if (0 < iVar16) {
                      lVar17 = 0;
                      do {
                        *pfVar23 = (float)*(uint *)((long)pvVar20 + lVar17 * 4);
                        pfVar23 = (float *)((long)pfVar23 + lVar18);
                        lVar17 = lVar17 + 1;
                      } while (iVar16 != (int)lVar17);
                    }
                  }
                  else if (uVar2 == 1) {
                    if (0 < iVar16) {
                      lVar17 = 0;
                      do {
                        uVar13 = *(uint *)((long)pvVar20 + lVar17 * 4);
                        uVar21 = 0x7c00;
                        if (uVar13 < 0xffe1) {
                          fVar11 = (float)(int)uVar13;
                          if ((uint)fVar11 < 0x38800000) {
                            if ((uint)fVar11 < 0x33000001) {
                              uVar21 = 0;
                            }
                            else {
                              uVar13 = (uint)fVar11 & 0x7fffff | 0x800000;
                              cVar5 = (char)((uint)fVar11 >> 0x17);
                              uVar21 = (ushort)(uVar13 >> (0x7eU - cVar5 & 0x1f));
                              if (0x80000000 < uVar13 << (cVar5 + 0xa2U & 0x1f)) {
                                uVar21 = uVar21 + 1;
                              }
                            }
                          }
                          else if ((uint)fVar11 < 0x7f800000) {
                            if ((uint)fVar11 < 0x477ff000) {
                              uVar21 = (ushort)((int)fVar11 + 0x8000fff +
                                                (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd);
                            }
                          }
                          else if (fVar11 != INFINITY) {
                            uVar13 = (uint)fVar11 >> 0xd & 0x3ff;
                            uVar21 = (ushort)(uVar13 == 0) | (ushort)uVar13 | 0x7c00;
                          }
                        }
                        *(ushort *)pfVar23 = uVar21;
                        pfVar23 = (float *)((long)pfVar23 + lVar18);
                        lVar17 = lVar17 + 1;
                      } while (iVar16 != (int)lVar17);
                    }
                  }
                  else {
                    if (uVar2 != 0) {
                      return 3;
                    }
                    if (0 < iVar16) {
                      lVar17 = 0;
                      do {
                        *pfVar23 = *(float *)((long)pvVar20 + lVar17 * 4);
                        pfVar23 = (float *)((long)pfVar23 + lVar18);
                        lVar17 = lVar17 + 1;
                      } while (iVar16 != (int)lVar17);
                    }
                  }
                }
                else if (uVar2 == 2) {
                  uVar2 = peVar4[lVar15].user_data_type;
                  if (uVar2 == 2) {
                    if (0 < iVar16) {
                      lVar17 = 0;
                      do {
                        *pfVar23 = *(float *)((long)pvVar20 + lVar17 * 4);
                        pfVar23 = (float *)((long)pfVar23 + lVar18);
                        lVar17 = lVar17 + 1;
                      } while (iVar16 != (int)lVar17);
                    }
                  }
                  else if (uVar2 == 1) {
                    if (0 < iVar16) {
                      lVar17 = 0;
                      do {
                        uVar13 = *(uint *)((long)pvVar20 + lVar17 * 4);
                        uVar10 = uVar13 & 0x7fffffff;
                        uVar21 = (ushort)(uVar13 >> 0x10) & 0x8000;
                        if (uVar10 < 0x38800000) {
                          if ((0x33000000 < uVar10) &&
                             (uVar13 = uVar13 & 0x7fffff | 0x800000, cVar5 = (char)(uVar10 >> 0x17),
                             uVar21 = uVar21 | (ushort)(uVar13 >> (0x7eU - cVar5 & 0x1f)),
                             0x80000000 < uVar13 << (cVar5 + 0xa2U & 0x1f))) {
                            uVar21 = uVar21 + 1;
                          }
                        }
                        else if (uVar10 < 0x7f800000) {
                          if (uVar10 < 0x477ff000) {
                            uVar21 = (ushort)(uVar10 + 0x8000fff + (uint)((uVar10 >> 0xd & 1) != 0)
                                             >> 0xd) | uVar21;
                          }
                          else {
                            uVar21 = uVar21 | 0x7c00;
                          }
                        }
                        else {
                          uVar21 = uVar21 | 0x7c00;
                          if (uVar10 != 0x7f800000) {
                            uVar13 = uVar10 >> 0xd & 0x3ff;
                            uVar21 = uVar21 | (ushort)uVar13 | (ushort)(uVar13 == 0);
                          }
                        }
                        *(ushort *)pfVar23 = uVar21;
                        pfVar23 = (float *)((long)pfVar23 + lVar18);
                        lVar17 = lVar17 + 1;
                      } while (iVar16 != (int)lVar17);
                    }
                  }
                  else {
                    if (uVar2 != 0) {
                      return 3;
                    }
                    if (0 < iVar16) {
                      lVar17 = 0;
                      do {
                        fVar11 = *(float *)((long)pvVar20 + lVar17 * 4);
                        fVar12 = 0.0;
                        if (0.0 <= fVar11) {
                          fVar12 = (float)(long)fVar11;
                          if (ABS(fVar11) == INFINITY) {
                            fVar12 = -NAN;
                          }
                          if (4.2949673e+09 < fVar11) {
                            fVar12 = -NAN;
                          }
                        }
                        *pfVar23 = fVar12;
                        pfVar23 = (float *)((long)pfVar23 + lVar18);
                        lVar17 = lVar17 + 1;
                      } while (iVar16 != (int)lVar17);
                    }
                  }
                }
                else {
                  if (uVar2 != 1) {
                    return 3;
                  }
                  uVar2 = peVar4[lVar15].user_data_type;
                  if (uVar2 == 2) {
                    if (0 < iVar16) {
                      lVar17 = 0;
                      do {
                        uVar10 = (uint)*(short *)((long)pvVar20 + lVar17 * 2);
                        uVar13 = uVar10 & 0x7fff;
                        uVar24 = uVar13 << 0xd;
                        fVar11 = (float)(uVar10 & 0x80000000);
                        if (uVar24 < 0x800000) {
                          if (uVar13 != 0) {
                            uVar10 = 0x1f;
                            if (uVar13 != 0) {
                              for (; uVar24 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                              }
                            }
                            iVar8 = (uVar10 ^ 0x1f) - 8;
                            fVar11 = (float)(((uint)fVar11 | uVar24 << ((byte)iVar8 & 0x1f) |
                                             0x38800000) + iVar8 * -0x800000);
                          }
                        }
                        else if (uVar24 < 0xf800000) {
                          fVar11 = (float)(((uint)fVar11 | uVar24) + 0x38000000);
                        }
                        else {
                          fVar11 = (float)((uint)fVar11 | uVar24 | 0x7f800000);
                        }
                        *pfVar23 = fVar11;
                        pfVar23 = (float *)((long)pfVar23 + lVar18);
                        lVar17 = lVar17 + 1;
                      } while (iVar16 != (int)lVar17);
                    }
                  }
                  else if (uVar2 == 1) {
                    if (0 < iVar16) {
                      lVar17 = 0;
                      do {
                        *(ushort *)pfVar23 = *(ushort *)((long)pvVar20 + lVar17 * 2);
                        pfVar23 = (float *)((long)pfVar23 + lVar18);
                        lVar17 = lVar17 + 1;
                      } while (iVar16 != (int)lVar17);
                    }
                  }
                  else {
                    if (uVar2 != 0) {
                      return 3;
                    }
                    if (0 < iVar16) {
                      lVar17 = 0;
                      do {
                        uVar21 = *(ushort *)((long)pvVar20 + lVar17 * 2);
                        uVar13 = (uint)uVar21;
                        if ((short)uVar21 < 0) {
                          fVar11 = 0.0;
                        }
                        else if ((~uVar13 & 0x7c00) == 0) {
                          fVar11 = (float)-(uint)((uVar21 & 0x3ff) == 0);
                        }
                        else {
                          uVar10 = uVar13 * 0x2000;
                          if (uVar13 < 0x400) {
                            if (uVar21 == 0) {
                              fVar11 = 0.0;
                            }
                            else {
                              uVar24 = 0x1f;
                              if (uVar13 != 0) {
                                for (; uVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
                                }
                              }
                              iVar8 = (uVar24 ^ 0x1f) - 8;
                              fVar11 = (float)((uVar10 << ((byte)iVar8 & 0x1f) | 0x38800000) +
                                              iVar8 * -0x800000);
                            }
                          }
                          else if (uVar13 < 0x7c00) {
                            fVar11 = (float)(uVar10 + 0x38000000);
                          }
                          else {
                            fVar11 = (float)(uVar10 | 0x7f800000);
                          }
                          fVar11 = (float)(long)fVar11;
                        }
                        *pfVar23 = fVar11;
                        pfVar23 = (float *)((long)pfVar23 + lVar18);
                        lVar17 = lVar17 + 1;
                      } while (iVar16 != (int)lVar17);
                    }
                  }
                }
              }
              puVar25 = puVar25 + ((long)iVar9 & 0xfffffffffffffff8);
              pvVar20 = (void *)((long)pvVar20 + (long)(iVar16 * cVar1));
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar3);
            sVar6 = decode->channel_count;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < sVar6);
      }
      piVar19 = piVar19 + (int)uVar3;
      lVar22 = lVar22 + 1;
    } while (lVar22 != lVar7);
  }
  return 0;
}

Assistant:

static exr_result_t
generic_unpack_deep_pointers (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = (const uint8_t*) decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    void**         pdata;
    int            w, h, bpc, ubpc;

    w = decode->chunk.width;
    h = decode->chunk.height;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;
            size_t                     pixstride;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            pdata = (void**) decc->decode_to_ptr;

            if (!pdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];
                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);
                continue;
            }

            pdata += ((size_t) y) *
                     (((size_t) decc->user_line_stride) / sizeof (void*));
            pixstride = ((size_t) decc->user_pixel_stride) / sizeof (void*);

            for (int x = 0; x < w; ++x)
            {
                void*   outpix = *pdata;
                int32_t samps  = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                pdata += pixstride;
                if (outpix)
                {
                    uint8_t* cdata = (uint8_t*) outpix;
                    UNPACK_SAMPLES (samps)
                }
                srcbuffer += bpc * samps;
            }
        }
        sampbuffer += w;
    }
    return EXR_ERR_SUCCESS;
}